

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hash.c
# Opt level: O2

bool_t beltHashStepV(octet *hash,void *state)

{
  bool_t bVar1;
  
  beltHashStepG_internal(state);
  bVar1 = memEq(hash,(void *)((long)state + 0x50),0x20);
  return bVar1;
}

Assistant:

bool_t beltHashStepV(const octet hash[32], void* state)
{
	belt_hash_st* st = (belt_hash_st*)state;
	ASSERT(memIsValid(hash, 32));
	beltHashStepG_internal(state);
#if (OCTET_ORDER == BIG_ENDIAN)
	beltBlockRevU32(st->h1);
	beltBlockRevU32(st->h1 + 4);
#endif
	return memEq(hash, st->h1, 32);
}